

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::Serialization<diy::MemoryBuffer>::load(BinaryBuffer *bb,MemoryBuffer *x)

{
  BinaryBuffer *in_RSI;
  char *in_RDI;
  unsigned_long *in_stack_ffffffffffffffe8;
  
  load<unsigned_long>(in_RSI,in_stack_ffffffffffffffe8);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)bb,(size_type)x);
  if (in_RSI[1]._vptr_BinaryBuffer != (_func_int **)0x0) {
    std::vector<char,_std::allocator<char>_>::operator[]
              ((vector<char,_std::allocator<char>_> *)(in_RSI + 2),0);
    load<char>(in_RSI,in_RDI,0x19fb24);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, MemoryBuffer& x)
    {
      diy::load(bb, x.position);
      x.buffer.resize(x.position);
      if (x.position > 0)
          diy::load(bb, &x.buffer[0], x.position);
    }